

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O3

void crotg(complex<float> *ca,complex<float> cb,float *c,complex<float> *s)

{
  complex<float> z;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float in_XMM0_Db;
  undefined8 uVar5;
  float fVar6;
  undefined8 local_58;
  complex<float> cb_local;
  
  z._M_value = (_ComplexT_conflict)ca;
  fVar1 = cabs2((complex<float>)ca);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = cabs2(z);
    fVar2 = cabs2(z);
    fVar3 = cabs2(z);
    fVar4 = cabs2(z);
    fVar1 = SQRT(fVar4 * fVar4 + fVar3 * fVar3) * (fVar2 + fVar1);
    fVar2 = cabs2(z);
    fVar3 = (float)(ca->_M_value >> 0x20);
    fVar4 = (float)ca->_M_value / fVar2;
    fVar2 = fVar3 / fVar2;
    local_58 = CONCAT44(fVar3,fVar2);
    fVar3 = cabs2(z);
    *(float *)cb._M_value = fVar3 / fVar1;
    fVar3 = in_XMM0_Db * fVar2 + in_XMM0_Da * fVar4;
    fVar6 = in_XMM0_Da * fVar2 - in_XMM0_Db * fVar4;
    uVar5 = CONCAT44(fVar6,fVar3);
    if ((NAN(fVar3)) && (uVar5 = CONCAT44(fVar6,fVar3), NAN(fVar6))) {
      uVar5 = __mulsc3(fVar4,local_58,in_XMM0_Da,-in_XMM0_Db);
      local_58 = (ulong)(uint)fVar2;
    }
    *(ulong *)c = CONCAT44((float)((ulong)uVar5 >> 0x20) / fVar1,(float)uVar5 / fVar1);
    in_XMM0_Da = fVar4 * fVar1;
    in_XMM0_Db = (float)local_58 * fVar1;
  }
  else {
    *(undefined4 *)cb._M_value = 0;
    c[0] = 1.0;
    c[1] = 0.0;
  }
  ca->_M_value = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  return;
}

Assistant:

void crotg ( complex <float> *ca, complex <float> cb, float *c,
  complex <float> *s )

//****************************************************************************80
//
//  Purpose:
//
//    CROTG determines a Givens rotation.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    Given values A and B, this routine computes:
//
//    If A = 0:
//
//      R = B
//      C = 0
//      S = (1,0).
//
//    If A /= 0:
//
//      ALPHA = A / abs ( A )
//      NORM  = sqrt ( ( abs ( A ) )**2 + ( abs ( B ) )**2 )
//      R     = ALPHA * NORM
//      C     = abs ( A ) / NORM
//      S     = ALPHA * conj ( B ) / NORM
//
//    In either case, the computed numbers satisfy the equation:
//
//    (         C    S ) * ( A ) = ( R )
//    ( -conj ( S )  C )   ( B ) = ( 0 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 March 2007
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input/output, complex <float> *CA, on input, the value A.  On output,
//    the value R.
//
//    Input, complex <float> CB, the value B.
//
//    Output, float *C, the cosine of the Given rotation.
//
//    Output, complex <float> *S, the sine of the Givens rotation.
//
{
  complex <float> alpha;
  float norm;
  float scale;

  if ( cabs2 ( *ca ) == 0.0 )
  {
    *c = 0.0;
    *s = complex <float> ( 1.0, 0.0 );
    *ca = cb;
  }
  else
  {
    scale = cabs2 ( *ca ) + cabs2 ( cb );
    norm = scale * sqrt ( pow ( cabs2 ( *ca / scale ), 2 )
                        + pow ( cabs2 (  cb / scale ), 2 ) );
    alpha = *ca / cabs2 ( *ca );
    *c = cabs2 ( *ca ) / norm;
    *s = alpha * conj ( cb ) / norm;
    *ca = alpha * norm;
  }

  return;
}